

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantic_checker.cpp
# Opt level: O1

void __thiscall
mocker::SemanticChecker::collectSymbols::Collect::operator()(Collect *this,VarDecl *decl)

{
  ScopeID *pSVar1;
  element_type *peVar2;
  pointer pcVar3;
  SemanticContext *pSVar4;
  bool bVar5;
  DuplicatedSymbols *this_00;
  mapped_type *beg;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  string varName;
  VarDecl *local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  string local_60;
  shared_ptr<mocker::ast::Declaration> local_40;
  
  pSVar1 = this->scope;
  SymTbl::global(&this->ctx->syms);
  bVar5 = ScopeID::operator==(pSVar1,(ScopeID *)&local_60);
  if (local_60._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_60._M_dataplus._M_p,
                    local_60.field_2._M_allocated_capacity - (long)local_60._M_dataplus._M_p);
  }
  if (!bVar5) {
    peVar2 = (((decl->decl).super___shared_ptr<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr)->identifier).
             super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pcVar3 = (peVar2->val)._M_dataplus._M_p;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar3,pcVar3 + (peVar2->val)._M_string_length);
    pSVar1 = this->scope;
    pSVar4 = this->ctx;
    std::__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<mocker::ast::ASTNode,void>
              ((__shared_ptr<mocker::ast::ASTNode,(__gnu_cxx::_Lock_policy)2> *)&local_70,
               (__weak_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2> *)
               &(decl->super_Declaration).super_ASTNode.
                super_enable_shared_from_this<mocker::ast::ASTNode>);
    if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_68->_M_use_count = local_68->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_68->_M_use_count = local_68->_M_use_count + 1;
      }
    }
    local_40.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_70->super_Declaration;
    local_40.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_68;
    bVar5 = SymTbl::addSymbol(&pSVar4->syms,pSVar1,&local_60,&local_40);
    if (local_40.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.super___shared_ptr<mocker::ast::Declaration,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
    }
    if (!bVar5) {
      this_00 = (DuplicatedSymbols *)__cxa_allocate_exception(0x68);
      local_70 = decl;
      beg = std::__detail::
            _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::at((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)this->pos,(key_type *)&local_70);
      DuplicatedSymbols::DuplicatedSymbols(this_00,&beg->first,&beg->second,&local_60);
      __cxa_throw(this_00,&DuplicatedSymbols::typeinfo,DuplicatedSymbols::~DuplicatedSymbols);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void operator()(ast::VarDecl &decl) const override {
#ifdef DISABLE_FORWARD_REFERENCE_FOR_GLOBAL_VAR
      if (scope == ctx.syms.global())
        return;
#endif
      std::string varName = decl.decl->identifier->val;
      auto res = ctx.syms.addSymbol(
          scope, varName,
          std::static_pointer_cast<ast::VarDecl>(decl.shared_from_this()));
      if (!res)
        throw DuplicatedSymbols(pos.at(decl.getID()), varName);
    }